

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hold_ptr.h
# Opt level: O3

basic_content_filter * __thiscall cppcms::http::request::release_content_filter(request *this)

{
  _data *p_Var1;
  basic_content_filter *pbVar2;
  
  p_Var1 = (this->d).ptr_;
  if (p_Var1->filter_owned == true) {
    pbVar2 = p_Var1->filter;
    p_Var1->filter = (basic_content_filter *)0x0;
    p_Var1->filter_owned = false;
    return pbVar2;
  }
  p_Var1->filter = (basic_content_filter *)0x0;
  return (basic_content_filter *)0x0;
}

Assistant:

T *operator->() { return ptr_; }